

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

int __thiscall TPZFBMatrix<std::complex<float>_>::Zero(TPZFBMatrix<std::complex<float>_> *this)

{
  long lVar1;
  int64_t i;
  long lVar2;
  
  lVar1 = (this->fElem).fNElements;
  for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    (this->fElem).fStore[lVar2]._M_value = 0;
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

inline int64_t size() const { return fNElements; }